

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O2

void __thiscall
ExprTest_NumericConstant_Test::ExprTest_NumericConstant_Test(ExprTest_NumericConstant_Test *this)

{
  ExprTest::ExprTest(&this->super_ExprTest);
  (this->super_ExprTest).super_Test._vptr_Test = (_func_int **)&PTR__ExprTest_0018eda8;
  return;
}

Assistant:

TEST_F(ExprTest, NumericConstant) {
  mp::NumericConstant e;
  EXPECT_TRUE(e == 0);
  (void)NumericExpr(e);
  e = factory_.MakeNumericConstant(1.23);
  EXPECT_EQ(expr::NUMBER, e.kind());
  EXPECT_TRUE(e != 0);
  EXPECT_EQ(1.23, e.value());
}